

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O1

optional<helics::ActionMessage> * __thiscall
gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
          (optional<helics::ActionMessage> *__return_storage_ptr__,
          SimpleQueue<helics::ActionMessage,_std::mutex> *this)

{
  int iVar1;
  ActionMessage *this_00;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if (iVar1 == 0) {
    checkPullandSwap(this);
    if (((this->queueEmptyFlag)._M_base._M_i & 1U) == 0) {
      helics::ActionMessage::ActionMessage
                ((ActionMessage *)__return_storage_ptr__,
                 (this->pullElements).
                 super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1);
      (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload
      .super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_engaged = true;
      this_00 = (this->pullElements).
                super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1;
      (this->pullElements).
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_finish = this_00;
      helics::ActionMessage::~ActionMessage(this_00);
      checkPullandSwap(this);
    }
    else {
      (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload
      .super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::optional<X> pop()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            checkPullandSwap();
            if (queueEmptyFlag) {
                return std::nullopt;
            }
            std::optional<X> val(
                std::move(pullElements.back()));  // do it this way to
                                                  // allow moveable only
                                                  // types
            pullElements.pop_back();
            checkPullandSwap();
            return val;
        }